

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightBounds> * __thiscall
pbrt::SpotLight::Bounds(optional<pbrt::LightBounds> *__return_storage_ptr__,SpotLight *this)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  float fVar6;
  Float FVar7;
  float fVar8;
  Float FVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  bool bVar14;
  Float aFVar15 [4];
  uint uVar16;
  float *__result;
  float *pfVar17;
  ulong uVar18;
  long lVar19;
  float *pfVar20;
  int iVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  pfVar17 = (this->Iemit).values.ptr;
  uVar18 = (this->Iemit).values.nStored;
  if (1 < uVar18) {
    auVar25 = ZEXT464((uint)*pfVar17);
    lVar19 = uVar18 * 4 + -4;
    pfVar20 = pfVar17;
    do {
      pfVar20 = pfVar20 + 1;
      fVar27 = auVar25._0_4_;
      auVar32 = vmaxss_avx(ZEXT416((uint)*pfVar20),auVar25._0_16_);
      auVar25 = ZEXT1664(auVar32);
      if (fVar27 < *pfVar20) {
        pfVar17 = pfVar20;
      }
      lVar19 = lVar19 + -4;
    } while (lVar19 != 0);
  }
  aFVar15 = (this->super_LightBase).renderFromLight.m.m[0];
  auVar32 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1);
  auVar31 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2);
  auVar22 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3);
  FVar1 = (this->super_LightBase).renderFromLight.m.m[1][0];
  FVar2 = (this->super_LightBase).renderFromLight.m.m[1][1];
  FVar3 = (this->super_LightBase).renderFromLight.m.m[1][2];
  FVar4 = (this->super_LightBase).renderFromLight.m.m[1][3];
  FVar5 = (this->super_LightBase).renderFromLight.m.m[2][0];
  fVar27 = (this->super_LightBase).renderFromLight.m.m[2][1];
  fVar28 = (this->super_LightBase).renderFromLight.m.m[2][2];
  fVar6 = (this->super_LightBase).renderFromLight.m.m[2][3];
  FVar7 = (this->super_LightBase).renderFromLight.m.m[3][0];
  fVar8 = (this->super_LightBase).renderFromLight.m.m[3][1];
  FVar9 = (this->super_LightBase).renderFromLight.m.m[3][2];
  fVar10 = (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar11 = this->scale;
  fVar12 = *pfVar17;
  fVar23 = acosf(this->cosFalloffEnd);
  fVar24 = acosf(this->cosFalloffStart);
  fVar24 = cosf(fVar23 - fVar24);
  fVar23 = this->cosFalloffStart;
  if ((fVar24 == 1.0) && (!NAN(fVar24))) {
    if ((this->cosFalloffEnd != fVar23) || (NAN(this->cosFalloffEnd) || NAN(fVar23))) {
      fVar24 = 0.999;
    }
    else {
      fVar24 = 1.0;
    }
  }
  auVar26 = ZEXT816(0) << 0x40;
  __return_storage_ptr__->set = true;
  auVar32 = vinsertps_avx(auVar32,ZEXT416((uint)FVar2),0x10);
  auVar29._0_4_ = auVar32._0_4_ * 0.0;
  auVar29._4_4_ = auVar32._4_4_ * 0.0;
  auVar29._8_4_ = auVar32._8_4_ * 0.0;
  auVar29._12_4_ = auVar32._12_4_ * 0.0;
  auVar32 = vfmadd213ss_fma(ZEXT416((uint)FVar5),auVar26,ZEXT416((uint)(fVar27 * 0.0)));
  auVar30 = vfmadd213ss_fma(ZEXT416((uint)FVar7),auVar26,ZEXT416((uint)(fVar8 * 0.0)));
  fVar27 = fVar28 + auVar32._0_4_;
  auVar34 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar28),auVar26);
  auVar32 = vinsertps_avx((undefined1  [16])aFVar15,ZEXT416((uint)FVar1),0x10);
  auVar30 = vfmadd213ss_fma(ZEXT416((uint)FVar9),auVar26,auVar30);
  fVar10 = auVar30._0_4_ + fVar10;
  fVar6 = auVar34._0_4_ + fVar6;
  bVar14 = fVar10 == 1.0;
  auVar30 = vfmadd213ps_fma(auVar32,ZEXT816(0) << 0x40,auVar29);
  auVar32 = vinsertps_avx(auVar31,ZEXT416((uint)FVar3),0x10);
  auVar34._0_4_ = auVar30._0_4_ + auVar32._0_4_;
  auVar34._4_4_ = auVar30._4_4_ + auVar32._4_4_;
  auVar34._8_4_ = auVar30._8_4_ + auVar32._8_4_;
  auVar34._12_4_ = auVar30._12_4_ + auVar32._12_4_;
  auVar32 = vfmadd231ps_fma(auVar30,auVar32,ZEXT816(0) << 0x40);
  auVar31._4_4_ = fVar10;
  auVar31._0_4_ = fVar10;
  auVar31._8_4_ = fVar10;
  auVar31._12_4_ = fVar10;
  uVar16 = 0xff;
  if (!bVar14) {
    uVar16 = 0;
  }
  auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)FVar4),0x10);
  uVar18 = (ulong)uVar16;
  if (NAN(fVar10)) {
    uVar18 = 0;
  }
  auVar35._0_4_ = auVar34._0_4_ * auVar34._0_4_;
  auVar35._4_4_ = auVar34._4_4_ * auVar34._4_4_;
  auVar35._8_4_ = auVar34._8_4_ * auVar34._8_4_;
  auVar35._12_4_ = auVar34._12_4_ * auVar34._12_4_;
  auVar30 = vhaddps_avx(auVar35,auVar35);
  iVar21 = (uint)bVar14 * (int)fVar6 + (uint)!bVar14 * (int)(fVar6 / fVar10);
  auVar26._0_4_ = auVar32._0_4_ + auVar22._0_4_;
  auVar26._4_4_ = auVar32._4_4_ + auVar22._4_4_;
  auVar26._8_4_ = auVar32._8_4_ + auVar22._8_4_;
  auVar26._12_4_ = auVar32._12_4_ + auVar22._12_4_;
  auVar32 = vdivps_avx(auVar26,auVar31);
  auVar31 = ZEXT416((uint)(auVar30._0_4_ + fVar27 * fVar27));
  auVar31 = vsqrtss_avx(auVar31,auVar31);
  bVar14 = (bool)((byte)uVar18 & 1);
  auVar22._0_4_ = (uint)bVar14 * (int)auVar26._0_4_ | (uint)!bVar14 * auVar32._0_4_;
  bVar14 = (bool)((byte)(uVar18 >> 1) & 1);
  auVar22._4_4_ = (uint)bVar14 * (int)auVar26._4_4_ | (uint)!bVar14 * auVar32._4_4_;
  bVar14 = (bool)((byte)(uVar18 >> 2) & 1);
  auVar22._8_4_ = (uint)bVar14 * (int)auVar26._8_4_ | (uint)!bVar14 * auVar32._8_4_;
  bVar14 = (bool)((byte)(uVar18 >> 3) & 1);
  auVar22._12_4_ = (uint)bVar14 * (int)auVar26._12_4_ | (uint)!bVar14 * auVar32._12_4_;
  uVar13 = vmovlps_avx(auVar22);
  *(undefined8 *)&__return_storage_ptr__->optionalValue = uVar13;
  *(int *)((long)&__return_storage_ptr__->optionalValue + 8) = iVar21;
  uVar13 = vmovlps_avx(auVar22);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = uVar13;
  *(int *)((long)&__return_storage_ptr__->optionalValue + 0x14) = iVar21;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       fVar12 * fVar11 * 4.0 * 3.1415927;
  auVar32._0_4_ = auVar31._0_4_;
  fVar27 = fVar27 / auVar32._0_4_;
  auVar32._4_4_ = auVar32._0_4_;
  auVar32._8_4_ = auVar32._0_4_;
  auVar32._12_4_ = auVar32._0_4_;
  auVar32 = vdivps_avx(auVar34,auVar32);
  auVar30._0_4_ = auVar32._0_4_ * auVar32._0_4_;
  auVar30._4_4_ = auVar32._4_4_ * auVar32._4_4_;
  auVar30._8_4_ = auVar32._8_4_ * auVar32._8_4_;
  auVar30._12_4_ = auVar32._12_4_ * auVar32._12_4_;
  auVar31 = vhaddps_avx(auVar30,auVar30);
  auVar31 = ZEXT416((uint)(fVar27 * fVar27 + auVar31._0_4_));
  auVar31 = vsqrtss_avx(auVar31,auVar31);
  fVar28 = auVar31._0_4_;
  auVar33._4_4_ = fVar28;
  auVar33._0_4_ = fVar28;
  auVar33._8_4_ = fVar28;
  auVar33._12_4_ = fVar28;
  auVar32 = vdivps_avx(auVar32,auVar33);
  uVar13 = vmovlps_avx(auVar32);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar13;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = fVar27 / fVar28;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = fVar23;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = fVar24;
  (__return_storage_ptr__->optionalValue).__data[0x30] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> SpotLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Float phi = scale * Iemit.MaxValue() * 4 * Pi;
    Float cosTheta_e = std::cos(std::acos(cosFalloffEnd) - std::acos(cosFalloffStart));
    // Allow a little slop here to deal with fp round-off error in the computation of
    // cosTheta_p in the importance function.
    if (cosTheta_e == 1 && cosFalloffEnd != cosFalloffStart)
        cosTheta_e = 0.999f;
    return LightBounds(Bounds3f(p, p), w, phi, cosFalloffStart, cosTheta_e, false);
}